

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * QLocale::scriptToCode(Script script)

{
  QString *in_RDI;
  QLatin1StringView QVar1;
  QLatin1StringView in_stack_00000000;
  
  QVar1 = QLocalePrivate::scriptToCode((Script)((ulong)in_RDI >> 0x30));
  QString::QString((QString *)QVar1.m_size,in_stack_00000000);
  return in_RDI;
}

Assistant:

QString QLocale::scriptToCode(Script script)
{
    return QLocalePrivate::scriptToCode(script);
}